

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::~TPZVec
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar1;
  _Invoker_type p_Var2;
  _Any_data *p_Var3;
  _Any_data *p_Var4;
  long lVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01920c70;
  pfVar1 = this->fStore;
  if (pfVar1 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
    p_Var2 = pfVar1[-1]._M_invoker;
    if (p_Var2 != (_Invoker_type)0x0) {
      lVar5 = (long)p_Var2 * -0x20;
      p_Var3 = (_Any_data *)(pfVar1 + (long)p_Var2);
      do {
        p_Var4 = p_Var3 + -2;
        if (*(_Manager_type *)(p_Var3 + -1) != (_Manager_type)0x0) {
          (**(_Manager_type *)(p_Var3 + -1))(p_Var4,p_Var4,__destroy_functor);
        }
        lVar5 = lVar5 + 0x20;
        p_Var3 = p_Var4;
      } while (lVar5 != 0);
    }
    operator_delete__(&pfVar1[-1]._M_invoker,(long)p_Var2 << 5 | 8);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}